

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

void am_delete_script_commands_proc(Am_Object *cmd)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  int value;
  Am_Object execute_command;
  Am_Object script_window;
  Am_Object found_sel;
  Am_Object this_cmd;
  Am_Object scroll_menu;
  Am_Value_List sel_list;
  Am_Value_List new_cmd_list;
  Am_Value_List orig_cmds;
  Am_Value_List new_original_command_list;
  Am_Value_List original_command_list;
  
  Am_Object::Get_Object((Am_Object *)&sel_list,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&script_window,(Am_Slot_Flags)&sel_list);
  Am_Object::~Am_Object((Am_Object *)&sel_list);
  pAVar3 = Am_Object::Get(&script_window,Am_UNDO_SCROLL_GROUP,0);
  Am_Object::Am_Object(&scroll_menu,pAVar3);
  pAVar3 = Am_Object::Get(&scroll_menu,0x169,0);
  Am_Value_List::Am_Value_List(&sel_list,pAVar3);
  pAVar3 = Am_Object::Get(&script_window,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&execute_command,pAVar3);
  pAVar3 = Am_Object::Get(&execute_command,Am_COMMANDS_PROTOTYPES,0);
  Am_Value_List::Am_Value_List(&orig_cmds,pAVar3);
  pAVar3 = Am_Object::Get(&execute_command,Am_ORIGINAL_COMMAND_LIST,0);
  Am_Value_List::Am_Value_List(&original_command_list,pAVar3);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&orig_cmds);
  Am_Object::Set(cmd,0x16c,pAVar4,0);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&original_command_list);
  Am_Object::Set(cmd,AVar1,pAVar4,0);
  this_cmd.data = (Am_Object_Data *)0x0;
  found_sel.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&new_cmd_list);
  Am_Value_List::Am_Value_List(&new_original_command_list);
  Am_Value_List::Start(&orig_cmds);
  value = 1;
  while( true ) {
    bVar2 = Am_Value_List::Last(&orig_cmds);
    AVar1 = Am_COMMANDS_PROTOTYPES;
    if (bVar2) break;
    pAVar3 = Am_Value_List::Get(&orig_cmds);
    Am_Object::operator=(&this_cmd,pAVar3);
    bVar2 = am_find_cmd_in_sel(&sel_list,&this_cmd,&found_sel);
    if (!bVar2) {
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&this_cmd);
      Am_Value_List::Add(&new_cmd_list,pAVar4,Am_TAIL,true);
      pAVar3 = Am_Object::Get(&this_cmd,0xc,0);
      Am_Value_List::Add(&new_original_command_list,pAVar3,Am_TAIL,true);
      Am_Object::Set(&this_cmd,Am_COMMAND_INDEX_IN_SCRIPT,value,1);
      value = value + 1;
    }
    Am_Value_List::Next(&orig_cmds);
  }
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_cmd_list);
  Am_Object::Set(&execute_command,AVar1,pAVar4,0);
  AVar1 = Am_COMMANDS_IN_SCRIPT;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_cmd_list);
  Am_Object::Set(&execute_command,AVar1,pAVar4,0);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_original_command_list);
  Am_Object::Set(&execute_command,AVar1,pAVar4,0);
  am_set_commands_into_script_window(&script_window,&execute_command);
  Am_Value_List::~Am_Value_List(&new_original_command_list);
  Am_Value_List::~Am_Value_List(&new_cmd_list);
  Am_Object::~Am_Object(&found_sel);
  Am_Object::~Am_Object(&this_cmd);
  Am_Value_List::~Am_Value_List(&original_command_list);
  Am_Value_List::~Am_Value_List(&orig_cmds);
  Am_Object::~Am_Object(&execute_command);
  Am_Value_List::~Am_Value_List(&sel_list);
  Am_Object::~Am_Object(&scroll_menu);
  Am_Object::~Am_Object(&script_window);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_delete_script_commands,
                 (Am_Object cmd))
{
  // *** SHOULD FIX UP REFERENCES TO THE DELETED COMMANDS
  // *** PLACEHOLDERS SET BY THESE COMMANDS
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object scroll_menu = script_window.Get(Am_UNDO_SCROLL_GROUP);
  Am_Value_List sel_list = scroll_menu.Get(Am_VALUE);
  Am_Object execute_command = script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Value_List orig_cmds = execute_command.Get(Am_COMMANDS_PROTOTYPES);
  Am_Value_List original_command_list =
      execute_command.Get(Am_ORIGINAL_COMMAND_LIST);

  cmd.Set(Am_OLD_VALUE, orig_cmds);
  cmd.Set(Am_ORIGINAL_COMMAND_LIST, original_command_list);

  Am_Object this_cmd, found_sel;
  Am_Value_List new_cmd_list, new_original_command_list;
  int i = 1;
  for (orig_cmds.Start(); !orig_cmds.Last(); orig_cmds.Next()) {
    this_cmd = orig_cmds.Get();
    if (!am_find_cmd_in_sel(sel_list, this_cmd, found_sel)) {
      new_cmd_list.Add(this_cmd);
      new_original_command_list.Add(this_cmd.Get(Am_SOURCE_OF_COPY));
      this_cmd.Set(Am_COMMAND_INDEX_IN_SCRIPT, i++, Am_OK_IF_NOT_THERE);
    }
  }
  execute_command.Set(Am_COMMANDS_PROTOTYPES, new_cmd_list);
  execute_command.Set(Am_COMMANDS_IN_SCRIPT, new_cmd_list);
  execute_command.Set(Am_ORIGINAL_COMMAND_LIST, new_original_command_list);

  am_set_commands_into_script_window(script_window, execute_command);
}